

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryNodeAnim(aiNodeAnim *nd)

{
  uint32_t uVar1;
  size_t sVar2;
  aiAnimBehaviour local_20;
  aiAnimBehaviour local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t old;
  uint32_t len;
  aiNodeAnim *nd_local;
  
  local_14 = 0;
  _old = nd;
  local_18 = WriteMagic(0x1238);
  uVar1 = Write<aiString>(&_old->mNodeName);
  local_14 = uVar1 + local_14;
  uVar1 = Write<unsigned_int>(&_old->mNumPositionKeys);
  local_14 = uVar1 + local_14;
  uVar1 = Write<unsigned_int>(&_old->mNumRotationKeys);
  local_14 = uVar1 + local_14;
  uVar1 = Write<unsigned_int>(&_old->mNumScalingKeys);
  local_14 = uVar1 + local_14;
  local_1c = _old->mPreState;
  uVar1 = Write<unsigned_int>(&local_1c);
  local_14 = uVar1 + local_14;
  local_20 = _old->mPostState;
  uVar1 = Write<unsigned_int>(&local_20);
  local_14 = uVar1 + local_14;
  if (_old->mPositionKeys != (aiVectorKey *)0x0) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mPositionKeys,1,(ulong)_old->mNumPositionKeys * 0x18,(FILE *)out);
      local_14 = (int)sVar2 + local_14;
    }
    else {
      uVar1 = WriteBounds<aiVectorKey>(_old->mPositionKeys,_old->mNumPositionKeys);
      local_14 = uVar1 + local_14;
    }
  }
  if (_old->mRotationKeys != (aiQuatKey *)0x0) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mRotationKeys,1,(ulong)_old->mNumRotationKeys * 0x18,(FILE *)out);
      local_14 = (int)sVar2 + local_14;
    }
    else {
      uVar1 = WriteBounds<aiQuatKey>(_old->mRotationKeys,_old->mNumRotationKeys);
      local_14 = uVar1 + local_14;
    }
  }
  if (_old->mScalingKeys != (aiVectorKey *)0x0) {
    if ((shortened & 1U) == 0) {
      sVar2 = fwrite(_old->mScalingKeys,1,(ulong)_old->mNumScalingKeys * 0x18,(FILE *)out);
      local_14 = (int)sVar2 + local_14;
    }
    else {
      uVar1 = WriteBounds<aiVectorKey>(_old->mScalingKeys,_old->mNumScalingKeys);
      local_14 = uVar1 + local_14;
    }
  }
  ChangeInteger(local_18,local_14);
  return local_14;
}

Assistant:

uint32_t WriteBinaryNodeAnim(const aiNodeAnim* nd)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AINODEANIM);

	len += Write<aiString>(nd->mNodeName);
	len += Write<unsigned int>(nd->mNumPositionKeys);
	len += Write<unsigned int>(nd->mNumRotationKeys);
	len += Write<unsigned int>(nd->mNumScalingKeys);
	len += Write<unsigned int>(nd->mPreState);
	len += Write<unsigned int>(nd->mPostState);

	if (nd->mPositionKeys) {
		if (shortened) {
			len += WriteBounds(nd->mPositionKeys,nd->mNumPositionKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mPositionKeys,1,nd->mNumPositionKeys*sizeof(aiVectorKey),out));
	}
	if (nd->mRotationKeys) {
		if (shortened) {
			len += WriteBounds(nd->mRotationKeys,nd->mNumRotationKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mRotationKeys,1,nd->mNumRotationKeys*sizeof(aiQuatKey),out));
	}
	if (nd->mScalingKeys) {
		if (shortened) {
			len += WriteBounds(nd->mScalingKeys,nd->mNumScalingKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mScalingKeys,1,nd->mNumScalingKeys*sizeof(aiVectorKey),out));
	}

	ChangeInteger(old,len);
	return len;
}